

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiTextFilter::ImGuiTextRange::split
          (ImGuiTextRange *this,char separator,ImVector<ImGuiTextFilter::ImGuiTextRange> *out)

{
  int *piVar1;
  ImGuiTextRange *pIVar2;
  int iVar3;
  ImGuiTextRange *pIVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  
  if (out->Capacity < 0) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    if (out->Data != (ImGuiTextRange *)0x0) {
      memcpy(pIVar4,out->Data,(long)out->Size << 4);
      pIVar2 = out->Data;
      if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    out->Data = pIVar4;
    out->Capacity = 0;
  }
  out->Size = 0;
  pcVar7 = this->b;
  pcVar5 = this->e;
  if (pcVar7 < pcVar5) {
    iVar9 = 0;
    pcVar8 = pcVar7;
    do {
      if (*pcVar7 == separator) {
        if (iVar9 == out->Capacity) {
          if (iVar9 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar9 / 2 + iVar9;
          }
          iVar6 = iVar9 + 1;
          if (iVar9 + 1 < iVar3) {
            iVar6 = iVar3;
          }
          if (GImGui != (ImGuiContext_conflict1 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData)
          ;
          if (out->Data != (ImGuiTextRange *)0x0) {
            memcpy(pIVar4,out->Data,(long)out->Size << 4);
            pIVar2 = out->Data;
            if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
          }
          out->Data = pIVar4;
          out->Capacity = iVar6;
          iVar9 = out->Size;
        }
        else {
          pIVar4 = out->Data;
        }
        pIVar4[iVar9].b = pcVar8;
        pIVar4[iVar9].e = pcVar7;
        iVar9 = out->Size + 1;
        out->Size = iVar9;
        pcVar8 = pcVar7 + 1;
        pcVar5 = this->e;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar5);
    if (pcVar7 != pcVar8) {
      if (iVar9 == out->Capacity) {
        if (iVar9 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar9 / 2 + iVar9;
        }
        iVar6 = iVar9 + 1;
        if (iVar9 + 1 < iVar3) {
          iVar6 = iVar3;
        }
        if (GImGui != (ImGuiContext_conflict1 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
        if (out->Data != (ImGuiTextRange *)0x0) {
          memcpy(pIVar4,out->Data,(long)out->Size << 4);
          pIVar2 = out->Data;
          if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
        }
        out->Data = pIVar4;
        out->Capacity = iVar6;
        iVar9 = out->Size;
      }
      else {
        pIVar4 = out->Data;
      }
      pIVar4[iVar9].b = pcVar8;
      pIVar4[iVar9].e = pcVar7;
      out->Size = out->Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::ImGuiTextRange::split(char separator, ImVector<ImGuiTextRange>* out) const
{
    out->resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out->push_back(ImGuiTextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out->push_back(ImGuiTextRange(wb, we));
}